

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

int nsvg__parseSkewY(float *xform,char *str)

{
  int iVar1;
  undefined8 uStack_38;
  int len;
  float t [6];
  int na;
  float args [1];
  char *str_local;
  float *xform_local;
  
  t[4] = 0.0;
  iVar1 = nsvg__parseTransformArgs(str,t + 5,1,(int *)(t + 4));
  nsvg__xformSetSkewY((float *)&stack0xffffffffffffffc8,(t[5] / 180.0) * 3.1415927);
  *(undefined8 *)xform = uStack_38;
  *(undefined8 *)(xform + 2) = t._0_8_;
  *(undefined8 *)(xform + 4) = t._8_8_;
  return iVar1;
}

Assistant:

static int nsvg__parseSkewY(float* xform, const char* str)
{
	float args[1];
	int na = 0;
	float t[6];
	int len = nsvg__parseTransformArgs(str, args, 1, &na);
	nsvg__xformSetSkewY(t, args[0]/180.0f*NSVG_PI);
	memcpy(xform, t, sizeof(float)*6);
	return len;
}